

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.cpp
# Opt level: O1

void SHA1_Transform(SHA_CTX *c,uchar *data)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  int iVar28;
  int iVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  
  uVar6 = *(uint *)(data + 8);
  uVar17 = *(uint *)(data + 0xc);
  uVar1 = c->h0;
  uVar7 = c->h1;
  uVar12 = c->h2;
  uVar4 = uVar7 >> 2 | uVar7 << 0x1e;
  uVar7 = (uVar7 & uVar12 | ~uVar7 & c->h3) + 0x5a827999 +
          (uVar1 >> 0x1b | uVar1 << 5) + *(uint *)data + c->h4;
  uVar22 = uVar1 >> 2 | uVar1 << 0x1e;
  uVar5 = (uVar4 & uVar1 | ~uVar1 & uVar12) + *(uint *)(data + 4) + c->h3 + 0x5a827999 +
          (uVar7 >> 0x1b | uVar7 * 0x20);
  uVar19 = (uVar5 >> 0x1b | uVar5 * 0x20) + (uVar22 & uVar7 | ~uVar7 & uVar4) + uVar6 + uVar12 +
           0x5a827999;
  uVar10 = uVar7 >> 2 | uVar7 * 0x40000000;
  uVar8 = uVar5 >> 2 | uVar5 * 0x40000000;
  uVar7 = *(uint *)(data + 0x10);
  uVar4 = (uVar5 & uVar10 | ~uVar5 & uVar22) + uVar17 + uVar4 + 0x5a827999 +
          (uVar19 >> 0x1b | uVar19 * 0x20);
  uVar25 = uVar19 >> 2 | uVar19 * 0x40000000;
  uVar23 = uVar4 >> 2 | uVar4 * 0x40000000;
  uVar12 = *(uint *)(data + 0x14);
  uVar19 = (uVar4 >> 0x1b | uVar4 * 0x20) + (uVar8 & uVar19 | ~uVar19 & uVar10) + uVar7 + uVar22 +
           0x5a827999;
  uVar10 = (uVar4 & uVar25 | ~uVar4 & uVar8) + uVar10 + uVar12 + 0x5a827999 +
           (uVar19 >> 0x1b | uVar19 * 0x20);
  uVar20 = uVar19 >> 2 | uVar19 * 0x40000000;
  uVar4 = *(uint *)(data + 0x18);
  uVar15 = uVar10 >> 2 | uVar10 * 0x40000000;
  uVar5 = *(uint *)(data + 0x1c);
  uVar22 = (uVar10 >> 0x1b | uVar10 * 0x20) + (uVar19 & uVar23 | ~uVar19 & uVar25) + uVar8 + uVar4 +
           0x5a827999;
  uVar19 = (uVar10 & uVar20 | ~uVar10 & uVar23) + uVar5 + uVar25 + 0x5a827999 +
           (uVar22 >> 0x1b | uVar22 * 0x20);
  uVar25 = uVar22 >> 2 | uVar22 * 0x40000000;
  uVar10 = *(uint *)(data + 0x20);
  uVar24 = uVar19 >> 2 | uVar19 * 0x40000000;
  uVar8 = *(uint *)(data + 0x24);
  uVar26 = (uVar19 >> 0x1b | uVar19 * 0x20) + (uVar22 & uVar15 | ~uVar22 & uVar20) + uVar23 + uVar10
           + 0x5a827999;
  uVar23 = (uVar19 & uVar25 | ~uVar19 & uVar15) + uVar8 + uVar20 + 0x5a827999 +
           (uVar26 >> 0x1b | uVar26 * 0x20);
  uVar31 = uVar26 >> 2 | uVar26 * 0x40000000;
  uVar19 = *(uint *)(data + 0x28);
  uVar22 = *(uint *)(data + 0x34);
  uVar13 = uVar10 ^ uVar22 ^ *(uint *)data ^ uVar6;
  uVar27 = uVar23 >> 2 | uVar23 * 0x40000000;
  uVar20 = *(uint *)(data + 0x2c);
  uVar9 = (uVar23 >> 0x1b | uVar23 * 0x20) + (uVar26 & uVar24 | ~uVar26 & uVar25) + uVar19 + uVar15
          + 0x5a827999;
  uVar26 = (uVar23 & uVar31 | ~uVar23 & uVar24) + uVar25 + uVar20 + 0x5a827999 +
           (uVar9 >> 0x1b | uVar9 * 0x20);
  uVar23 = *(uint *)(data + 0x38);
  uVar21 = uVar8 ^ uVar23 ^ *(uint *)(data + 4) ^ uVar17;
  uVar11 = uVar9 >> 2 | uVar9 * 0x40000000;
  uVar25 = *(uint *)(data + 0x30);
  uVar15 = *(uint *)(data + 0x3c);
  uVar16 = uVar19 ^ uVar15 ^ uVar6 ^ uVar7;
  uVar14 = uVar26 >> 2 | uVar26 * 0x40000000;
  uVar9 = (uVar26 >> 0x1b | uVar26 * 0x20) + (uVar9 & uVar27 | ~uVar9 & uVar31) + uVar25 + uVar24 +
          0x5a827999;
  uVar6 = (uVar26 & uVar11 | ~uVar26 & uVar27) + uVar22 + uVar31 + 0x5a827999 +
          (uVar9 >> 0x1b | uVar9 * 0x20);
  uVar30 = uVar9 >> 2 | uVar9 * 0x40000000;
  uVar31 = uVar6 >> 2 | uVar6 * 0x40000000;
  uVar26 = (uVar6 >> 0x1b | uVar6 * 0x20) + (uVar9 & uVar14 | ~uVar9 & uVar11) + uVar23 + uVar27 +
           0x5a827999;
  uVar6 = (uVar6 & uVar30 | ~uVar6 & uVar14) + uVar11 + uVar15 + 0x5a827999 +
          (uVar26 >> 0x1b | uVar26 * 0x20);
  uVar27 = uVar26 >> 2 | uVar26 * 0x40000000;
  uVar24 = uVar13 >> 0x1f | uVar13 << 1;
  uVar13 = uVar6 >> 2 | uVar6 * 0x40000000;
  uVar21 = uVar21 >> 0x1f | uVar21 << 1;
  uVar9 = (uVar6 >> 0x1b | uVar6 * 0x20) + (uVar26 & uVar31 | ~uVar26 & uVar30) + uVar24 + uVar14 +
          0x5a827999;
  uVar6 = (uVar6 & uVar27 | ~uVar6 & uVar31) + uVar21 + uVar30 + 0x5a827999 +
          (uVar9 >> 0x1b | uVar9 * 0x20);
  uVar26 = uVar9 >> 2 | uVar9 * 0x40000000;
  uVar14 = uVar16 >> 0x1f | uVar16 << 1;
  uVar11 = uVar6 >> 2 | uVar6 * 0x40000000;
  uVar17 = uVar17 ^ uVar12 ^ uVar20 ^ uVar24;
  uVar30 = uVar17 >> 0x1f | uVar17 << 1;
  uVar31 = (uVar6 >> 0x1b | uVar6 * 0x20) + (uVar9 & uVar13 | ~uVar9 & uVar27) + uVar14 + uVar31 +
           0x5a827999;
  uVar6 = (uVar6 & uVar26 | ~uVar6 & uVar13) + uVar30 + uVar27 + 0x5a827999 +
          (uVar31 >> 0x1b | uVar31 * 0x20);
  uVar17 = uVar7 ^ uVar4 ^ uVar25 ^ uVar21;
  uVar16 = uVar17 >> 0x1f | uVar17 << 1;
  uVar17 = uVar12 ^ uVar5 ^ uVar22 ^ uVar14;
  uVar32 = uVar17 >> 0x1f | uVar17 << 1;
  uVar17 = (uVar26 ^ uVar11 ^ uVar31) + uVar16 + uVar13 + 0x6ed9eba1 +
           (uVar6 >> 0x1b | uVar6 * 0x20);
  uVar7 = uVar4 ^ uVar10 ^ uVar23 ^ uVar30;
  uVar9 = uVar7 >> 0x1f | uVar7 << 1;
  uVar4 = uVar31 >> 2 | uVar31 * 0x40000000;
  uVar12 = (uVar11 ^ uVar4 ^ uVar6) + uVar32 + uVar26 + 0x6ed9eba1 +
           (uVar17 >> 0x1b | uVar17 * 0x20);
  uVar7 = uVar5 ^ uVar8 ^ uVar15 ^ uVar16;
  uVar26 = uVar7 >> 0x1f | uVar7 << 1;
  uVar6 = uVar6 >> 2 | uVar6 * 0x40000000;
  uVar5 = (uVar4 ^ uVar6 ^ uVar17) + uVar9 + uVar11 + 0x6ed9eba1 + (uVar12 >> 0x1b | uVar12 * 0x20);
  uVar7 = uVar10 ^ uVar19 ^ uVar24 ^ uVar32;
  uVar11 = uVar7 >> 0x1f | uVar7 << 1;
  uVar7 = uVar17 >> 2 | uVar17 * 0x40000000;
  uVar17 = (uVar6 ^ uVar7 ^ uVar12) + uVar26 + uVar4 + 0x6ed9eba1 + (uVar5 >> 0x1b | uVar5 * 0x20);
  uVar4 = uVar8 ^ uVar20 ^ uVar21 ^ uVar9;
  uVar13 = uVar4 >> 0x1f | uVar4 << 1;
  uVar12 = uVar12 >> 2 | uVar12 * 0x40000000;
  uVar6 = (uVar7 ^ uVar12 ^ uVar5) + uVar11 + uVar6 + 0x6ed9eba1 + (uVar17 >> 0x1b | uVar17 * 0x20);
  uVar4 = uVar19 ^ uVar25 ^ uVar14 ^ uVar26;
  uVar31 = uVar4 >> 0x1f | uVar4 << 1;
  uVar10 = uVar5 >> 2 | uVar5 * 0x40000000;
  uVar7 = (uVar12 ^ uVar10 ^ uVar17) + uVar13 + uVar7 + 0x6ed9eba1 + (uVar6 >> 0x1b | uVar6 * 0x20);
  uVar4 = uVar20 ^ uVar22 ^ uVar30 ^ uVar11;
  uVar27 = uVar4 >> 0x1f | uVar4 << 1;
  uVar4 = uVar17 >> 2 | uVar17 * 0x40000000;
  uVar12 = (uVar10 ^ uVar4 ^ uVar6) + uVar31 + uVar12 + 0x6ed9eba1 + (uVar7 >> 0x1b | uVar7 * 0x20);
  uVar17 = uVar25 ^ uVar23 ^ uVar16 ^ uVar13;
  uVar5 = uVar17 >> 0x1f | uVar17 << 1;
  uVar8 = uVar6 >> 2 | uVar6 * 0x40000000;
  uVar10 = (uVar4 ^ uVar8 ^ uVar7) + uVar27 + uVar10 + 0x6ed9eba1 + (uVar12 >> 0x1b | uVar12 * 0x20)
  ;
  uVar6 = uVar22 ^ uVar15 ^ uVar32 ^ uVar31;
  uVar6 = uVar6 >> 0x1f | uVar6 << 1;
  uVar7 = uVar7 >> 2 | uVar7 * 0x40000000;
  uVar25 = (uVar8 ^ uVar7 ^ uVar12) + uVar5 + uVar4 + 0x6ed9eba1 + (uVar10 >> 0x1b | uVar10 * 0x20);
  uVar17 = uVar23 ^ uVar24 ^ uVar9 ^ uVar27;
  uVar17 = uVar17 >> 0x1f | uVar17 << 1;
  uVar19 = uVar12 >> 2 | uVar12 * 0x40000000;
  uVar12 = (uVar7 ^ uVar19 ^ uVar10) + uVar6 + uVar8 + 0x6ed9eba1 + (uVar25 >> 0x1b | uVar25 * 0x20)
  ;
  uVar4 = uVar15 ^ uVar21 ^ uVar26 ^ uVar5;
  uVar22 = uVar4 >> 0x1f | uVar4 << 1;
  uVar10 = uVar10 >> 2 | uVar10 * 0x40000000;
  uVar20 = (uVar19 ^ uVar10 ^ uVar25) + uVar17 + uVar7 + 0x6ed9eba1 +
           (uVar12 >> 0x1b | uVar12 * 0x20);
  uVar7 = uVar24 ^ uVar14 ^ uVar11 ^ uVar6;
  uVar8 = uVar7 >> 0x1f | uVar7 << 1;
  uVar4 = uVar25 >> 2 | uVar25 * 0x40000000;
  uVar23 = (uVar10 ^ uVar4 ^ uVar12) + uVar22 + uVar19 + 0x6ed9eba1 +
           (uVar20 >> 0x1b | uVar20 * 0x20);
  uVar7 = uVar21 ^ uVar30 ^ uVar13 ^ uVar17;
  uVar21 = uVar7 >> 0x1f | uVar7 << 1;
  uVar12 = uVar12 >> 2 | uVar12 * 0x40000000;
  uVar10 = (uVar4 ^ uVar12 ^ uVar20) + uVar8 + uVar10 + 0x6ed9eba1 +
           (uVar23 >> 0x1b | uVar23 * 0x20);
  uVar7 = uVar14 ^ uVar16 ^ uVar31 ^ uVar22;
  uVar7 = uVar7 >> 0x1f | uVar7 << 1;
  uVar19 = uVar20 >> 2 | uVar20 * 0x40000000;
  uVar4 = (uVar12 ^ uVar19 ^ uVar23) + uVar21 + uVar4 + 0x6ed9eba1 +
          (uVar10 >> 0x1b | uVar10 * 0x20);
  uVar20 = uVar30 ^ uVar32 ^ uVar27 ^ uVar8;
  uVar20 = uVar20 >> 0x1f | uVar20 << 1;
  uVar25 = uVar23 >> 2 | uVar23 * 0x40000000;
  uVar23 = (uVar19 ^ uVar25 ^ uVar10) + uVar7 + uVar12 + 0x6ed9eba1 + (uVar4 >> 0x1b | uVar4 * 0x20)
  ;
  uVar12 = uVar16 ^ uVar9 ^ uVar5 ^ uVar21;
  uVar16 = uVar12 >> 0x1f | uVar12 << 1;
  uVar10 = uVar10 >> 2 | uVar10 * 0x40000000;
  uVar15 = (uVar25 ^ uVar10 ^ uVar4) + uVar20 + uVar19 + 0x6ed9eba1 +
           (uVar23 >> 0x1b | uVar23 * 0x20);
  uVar12 = uVar32 ^ uVar26 ^ uVar6 ^ uVar7;
  uVar24 = uVar12 >> 0x1f | uVar12 << 1;
  uVar12 = uVar4 >> 2 | uVar4 * 0x40000000;
  uVar19 = (uVar10 ^ uVar12 ^ uVar23) + uVar16 + uVar25 + 0x6ed9eba1 +
           (uVar15 >> 0x1b | uVar15 * 0x20);
  uVar4 = uVar9 ^ uVar11 ^ uVar17 ^ uVar20;
  uVar14 = uVar4 >> 0x1f | uVar4 << 1;
  uVar25 = uVar23 >> 2 | uVar23 * 0x40000000;
  uVar4 = (uVar12 ^ uVar25 ^ uVar15) + uVar24 + uVar10 + 0x6ed9eba1 +
          (uVar19 >> 0x1b | uVar19 * 0x20);
  uVar10 = uVar26 ^ uVar13 ^ uVar22 ^ uVar16;
  uVar23 = uVar10 >> 0x1f | uVar10 << 1;
  uVar10 = uVar15 >> 2 | uVar15 * 0x40000000;
  uVar15 = (uVar25 ^ uVar10 ^ uVar19) + uVar14 + uVar12 + 0x6ed9eba1 +
           (uVar4 >> 0x1b | uVar4 * 0x20);
  uVar12 = uVar11 ^ uVar31 ^ uVar8 ^ uVar24;
  uVar9 = uVar12 >> 0x1f | uVar12 << 1;
  uVar19 = uVar19 >> 2 | uVar19 * 0x40000000;
  uVar25 = (uVar10 ^ uVar19 ^ uVar4) + uVar23 + uVar25 + 0x6ed9eba1 +
           (uVar15 >> 0x1b | uVar15 * 0x20);
  uVar4 = uVar4 >> 2 | uVar4 * 0x40000000;
  uVar11 = uVar15 >> 2 | uVar15 * 0x40000000;
  uVar15 = (uVar25 >> 0x1b | uVar25 * 0x20) + 0x8f1bbcdc +
           (uVar15 & uVar4 | (uVar15 | uVar4) & uVar19) + uVar9 + uVar10;
  uVar10 = uVar25 >> 2 | uVar25 * 0x40000000;
  uVar12 = uVar13 ^ uVar27 ^ uVar21 ^ uVar14;
  uVar30 = uVar12 >> 0x1f | uVar12 << 1;
  iVar28 = (uVar15 >> 0x1b | uVar15 * 0x20) +
           (uVar25 & uVar11 | (uVar25 | uVar11) & uVar4) + uVar19 + uVar30;
  uVar25 = uVar15 >> 2 | uVar15 * 0x40000000;
  uVar12 = uVar31 ^ uVar5 ^ uVar7 ^ uVar23;
  uVar13 = uVar12 >> 0x1f | uVar12 << 1;
  uVar26 = iVar28 + 0x8f1bbcdc;
  iVar18 = (uVar26 >> 0x1b | uVar26 * 0x20) +
           (uVar15 & uVar10 | (uVar15 | uVar10) & uVar11) + uVar13 + uVar4;
  uVar15 = uVar26 >> 2 | iVar28 * 0x40000000;
  uVar12 = uVar27 ^ uVar6 ^ uVar20 ^ uVar9;
  uVar4 = uVar12 >> 0x1f | uVar12 << 1;
  uVar19 = iVar18 + 0x8f1bbcdc;
  iVar28 = (uVar19 >> 0x1b | uVar19 * 0x20) +
           (uVar26 & uVar25 | (uVar26 | uVar25) & uVar10) + uVar4 + uVar11;
  uVar11 = uVar19 >> 2 | iVar18 * 0x40000000;
  uVar12 = uVar5 ^ uVar17 ^ uVar16 ^ uVar30;
  uVar5 = uVar12 >> 0x1f | uVar12 << 1;
  uVar26 = iVar28 + 0x8f1bbcdc;
  iVar18 = (uVar26 >> 0x1b | uVar26 * 0x20) +
           (uVar19 & uVar15 | (uVar19 | uVar15) & uVar25) + uVar10 + uVar5;
  uVar19 = uVar26 >> 2 | iVar28 * 0x40000000;
  uVar6 = uVar6 ^ uVar22 ^ uVar24 ^ uVar13;
  uVar10 = uVar6 >> 0x1f | uVar6 << 1;
  uVar12 = iVar18 + 0x8f1bbcdc;
  iVar28 = (uVar12 >> 0x1b | uVar12 * 0x20) +
           (uVar26 & uVar11 | (uVar26 | uVar11) & uVar15) + uVar10 + uVar25;
  uVar25 = uVar12 >> 2 | iVar18 * 0x40000000;
  uVar6 = uVar17 ^ uVar8 ^ uVar14 ^ uVar4;
  uVar27 = uVar6 >> 0x1f | uVar6 << 1;
  uVar26 = iVar28 + 0x8f1bbcdc;
  iVar18 = (uVar26 >> 0x1b | uVar26 * 0x20) +
           (uVar12 & uVar19 | (uVar12 | uVar19) & uVar11) + uVar27 + uVar15;
  uVar6 = uVar26 >> 2 | iVar28 * 0x40000000;
  uVar17 = uVar22 ^ uVar21 ^ uVar23 ^ uVar5;
  uVar12 = uVar17 >> 0x1f | uVar17 << 1;
  uVar22 = iVar18 + 0x8f1bbcdc;
  iVar28 = (uVar22 >> 0x1b | uVar22 * 0x20) +
           (uVar26 & uVar25 | (uVar26 | uVar25) & uVar19) + uVar12 + uVar11;
  uVar17 = uVar22 >> 2 | iVar18 * 0x40000000;
  uVar8 = uVar8 ^ uVar7 ^ uVar9 ^ uVar10;
  uVar8 = uVar8 >> 0x1f | uVar8 << 1;
  uVar15 = iVar28 + 0x8f1bbcdc;
  iVar29 = (uVar15 >> 0x1b | uVar15 * 0x20) +
           (uVar22 & uVar6 | (uVar22 | uVar6) & uVar25) + uVar8 + uVar19;
  uVar11 = uVar15 >> 2 | iVar28 * 0x40000000;
  uVar19 = uVar21 ^ uVar20 ^ uVar30 ^ uVar27;
  uVar19 = uVar19 >> 0x1f | uVar19 << 1;
  uVar26 = iVar29 + 0x8f1bbcdc;
  iVar18 = (uVar26 >> 0x1b | uVar26 * 0x20) +
           (uVar15 & uVar17 | (uVar15 | uVar17) & uVar6) + uVar25 + uVar19;
  uVar15 = uVar26 >> 2 | iVar29 * 0x40000000;
  uVar7 = uVar7 ^ uVar16 ^ uVar13 ^ uVar12;
  uVar22 = uVar7 >> 0x1f | uVar7 << 1;
  uVar25 = iVar18 + 0x8f1bbcdc;
  iVar28 = (uVar25 >> 0x1b | uVar25 * 0x20) +
           (uVar26 & uVar11 | (uVar26 | uVar11) & uVar17) + uVar6 + uVar22;
  uVar6 = uVar25 >> 2 | iVar18 * 0x40000000;
  uVar7 = uVar20 ^ uVar24 ^ uVar4 ^ uVar8;
  uVar20 = uVar7 >> 0x1f | uVar7 << 1;
  uVar21 = iVar28 + 0x8f1bbcdc;
  iVar29 = (uVar21 >> 0x1b | uVar21 * 0x20) +
           (uVar25 & uVar15 | (uVar25 | uVar15) & uVar11) + uVar17 + uVar20;
  uVar17 = uVar21 >> 2 | iVar28 * 0x40000000;
  uVar7 = uVar16 ^ uVar14 ^ uVar5 ^ uVar19;
  uVar26 = uVar7 >> 0x1f | uVar7 << 1;
  uVar16 = iVar29 + 0x8f1bbcdc;
  iVar18 = (uVar16 >> 0x1b | uVar16 * 0x20) +
           (uVar21 & uVar6 | (uVar21 | uVar6) & uVar15) + uVar11 + uVar26;
  uVar11 = uVar16 >> 2 | iVar29 * 0x40000000;
  uVar7 = uVar24 ^ uVar23 ^ uVar10 ^ uVar22;
  uVar32 = uVar7 >> 0x1f | uVar7 << 1;
  uVar25 = iVar18 + 0x8f1bbcdc;
  iVar28 = (uVar25 >> 0x1b | uVar25 * 0x20) +
           (uVar16 & uVar17 | (uVar16 | uVar17) & uVar6) + uVar15 + uVar32;
  uVar15 = uVar25 >> 2 | iVar18 * 0x40000000;
  uVar7 = uVar14 ^ uVar9 ^ uVar27 ^ uVar20;
  uVar24 = uVar7 >> 0x1f | uVar7 << 1;
  uVar7 = iVar28 + 0x8f1bbcdc;
  iVar18 = (uVar7 >> 0x1b | uVar7 * 0x20) +
           (uVar25 & uVar11 | (uVar25 | uVar11) & uVar17) + uVar6 + uVar24;
  uVar14 = uVar7 >> 2 | iVar28 * 0x40000000;
  uVar6 = uVar23 ^ uVar30 ^ uVar12 ^ uVar26;
  uVar21 = uVar6 >> 0x1f | uVar6 << 1;
  uVar6 = iVar18 + 0x8f1bbcdc;
  iVar28 = (uVar6 >> 0x1b | uVar6 * 0x20) +
           (uVar7 & uVar15 | (uVar7 | uVar15) & uVar11) + uVar17 + uVar21;
  uVar17 = uVar6 >> 2 | iVar18 * 0x40000000;
  uVar7 = uVar9 ^ uVar13 ^ uVar8 ^ uVar32;
  uVar25 = uVar7 >> 0x1f | uVar7 << 1;
  uVar7 = iVar28 + 0x8f1bbcdc;
  iVar18 = (uVar7 >> 0x1b | uVar7 * 0x20) +
           (uVar6 & uVar14 | (uVar6 | uVar14) & uVar15) + uVar11 + uVar25;
  uVar9 = uVar7 >> 2 | iVar28 * 0x40000000;
  uVar6 = uVar30 ^ uVar4 ^ uVar19 ^ uVar24;
  uVar16 = uVar6 >> 0x1f | uVar6 << 1;
  uVar23 = iVar18 + 0x8f1bbcdc;
  iVar29 = (uVar23 >> 0x1b | uVar23 * 0x20) +
           (uVar7 & uVar17 | (uVar7 | uVar17) & uVar14) + uVar16 + uVar15;
  uVar6 = uVar23 >> 2 | iVar18 * 0x40000000;
  uVar7 = uVar13 ^ uVar5 ^ uVar22 ^ uVar21;
  uVar31 = uVar7 >> 0x1f | uVar7 << 1;
  uVar7 = iVar29 + 0x8f1bbcdc;
  iVar28 = (uVar7 >> 0x1b | uVar7 * 0x20) +
           (uVar23 & uVar9 | (uVar23 | uVar9) & uVar17) + uVar31 + uVar14;
  uVar15 = uVar7 >> 2 | iVar29 * 0x40000000;
  uVar4 = uVar4 ^ uVar10 ^ uVar20 ^ uVar25;
  uVar11 = uVar4 >> 0x1f | uVar4 << 1;
  uVar4 = iVar28 + 0x8f1bbcdc;
  iVar18 = (uVar4 >> 0x1b | uVar4 * 0x20) +
           (uVar7 & uVar6 | (uVar7 | uVar6) & uVar9) + uVar17 + uVar11;
  uVar7 = iVar18 + 0x8f1bbcdc;
  uVar17 = uVar5 ^ uVar27 ^ uVar26 ^ uVar16;
  uVar13 = uVar17 >> 0x1f | uVar17 << 1;
  uVar17 = uVar10 ^ uVar12 ^ uVar32 ^ uVar31;
  uVar23 = uVar17 >> 0x1f | uVar17 << 1;
  uVar17 = (uVar6 ^ uVar15 ^ uVar4) + uVar13 + uVar9 + -0x359d3e2a + (uVar7 >> 0x1b | uVar7 * 0x20);
  uVar5 = uVar27 ^ uVar8 ^ uVar24 ^ uVar11;
  uVar27 = uVar5 >> 0x1f | uVar5 << 1;
  uVar4 = uVar4 >> 2 | iVar28 * 0x40000000;
  uVar9 = (uVar15 ^ uVar4 ^ uVar7) + uVar23 + uVar6 + -0x359d3e2a + (uVar17 >> 0x1b | uVar17 * 0x20)
  ;
  uVar6 = uVar12 ^ uVar19 ^ uVar21 ^ uVar13;
  uVar10 = uVar6 >> 0x1f | uVar6 << 1;
  uVar7 = uVar7 >> 2 | iVar18 * 0x40000000;
  uVar15 = (uVar4 ^ uVar7 ^ uVar17) + uVar27 + uVar15 + -0x359d3e2a + (uVar9 >> 0x1b | uVar9 * 0x20)
  ;
  uVar6 = uVar8 ^ uVar22 ^ uVar25 ^ uVar23;
  uVar33 = uVar6 >> 0x1f | uVar6 << 1;
  uVar17 = uVar17 >> 2 | uVar17 * 0x40000000;
  uVar8 = (uVar7 ^ uVar17 ^ uVar9) + uVar10 + uVar4 + -0x359d3e2a + (uVar15 >> 0x1b | uVar15 * 0x20)
  ;
  uVar6 = uVar19 ^ uVar20 ^ uVar16 ^ uVar27;
  uVar5 = uVar6 >> 0x1f | uVar6 << 1;
  uVar6 = uVar9 >> 2 | uVar9 * 0x40000000;
  uVar7 = (uVar17 ^ uVar6 ^ uVar15) + uVar33 + uVar7 + -0x359d3e2a + (uVar8 >> 0x1b | uVar8 * 0x20);
  uVar12 = uVar22 ^ uVar26 ^ uVar31 ^ uVar10;
  uVar9 = uVar12 >> 0x1f | uVar12 << 1;
  uVar12 = uVar15 >> 2 | uVar15 * 0x40000000;
  uVar17 = (uVar6 ^ uVar12 ^ uVar8) + uVar5 + uVar17 + -0x359d3e2a + (uVar7 >> 0x1b | uVar7 * 0x20);
  uVar4 = uVar20 ^ uVar32 ^ uVar11 ^ uVar33;
  uVar22 = uVar4 >> 0x1f | uVar4 << 1;
  uVar19 = uVar8 >> 2 | uVar8 * 0x40000000;
  uVar4 = (uVar12 ^ uVar19 ^ uVar7) + uVar9 + uVar6 + -0x359d3e2a + (uVar17 >> 0x1b | uVar17 * 0x20)
  ;
  uVar6 = uVar26 ^ uVar24 ^ uVar13 ^ uVar5;
  uVar8 = uVar6 >> 0x1f | uVar6 << 1;
  uVar7 = uVar7 >> 2 | uVar7 * 0x40000000;
  uVar14 = (uVar19 ^ uVar7 ^ uVar17) + uVar22 + uVar12 + -0x359d3e2a +
           (uVar4 >> 0x1b | uVar4 * 0x20);
  uVar6 = uVar32 ^ uVar21 ^ uVar23 ^ uVar9;
  uVar30 = uVar6 >> 0x1f | uVar6 << 1;
  uVar17 = uVar17 >> 2 | uVar17 * 0x40000000;
  uVar20 = (uVar7 ^ uVar17 ^ uVar4) + uVar8 + uVar19 + -0x359d3e2a +
           (uVar14 >> 0x1b | uVar14 * 0x20);
  uVar6 = uVar24 ^ uVar25 ^ uVar27 ^ uVar22;
  uVar26 = uVar6 >> 0x1f | uVar6 << 1;
  uVar12 = uVar4 >> 2 | uVar4 * 0x40000000;
  uVar7 = (uVar17 ^ uVar12 ^ uVar14) + uVar30 + uVar7 + -0x359d3e2a +
          (uVar20 >> 0x1b | uVar20 * 0x20);
  uVar6 = uVar21 ^ uVar16 ^ uVar10 ^ uVar8;
  uVar15 = uVar6 >> 0x1f | uVar6 << 1;
  uVar6 = uVar14 >> 2 | uVar14 * 0x40000000;
  uVar4 = (uVar12 ^ uVar6 ^ uVar20) + uVar26 + uVar17 + -0x359d3e2a + (uVar7 >> 0x1b | uVar7 * 0x20)
  ;
  uVar17 = uVar25 ^ uVar31 ^ uVar33 ^ uVar30;
  uVar19 = uVar17 >> 0x1f | uVar17 << 1;
  uVar14 = uVar11 ^ uVar23 ^ uVar22 ^ uVar19;
  uVar22 = uVar20 >> 2 | uVar20 * 0x40000000;
  uVar17 = (uVar6 ^ uVar22 ^ uVar7) + uVar15 + uVar12 + -0x359d3e2a + (uVar4 >> 0x1b | uVar4 * 0x20)
  ;
  uVar12 = uVar16 ^ uVar11 ^ uVar5 ^ uVar26;
  uVar12 = uVar12 >> 0x1f | uVar12 << 1;
  uVar25 = uVar13 ^ uVar27 ^ uVar8 ^ uVar12;
  uVar20 = uVar7 >> 2 | uVar7 * 0x40000000;
  uVar8 = (uVar22 ^ uVar20 ^ uVar4) + uVar19 + uVar6 + -0x359d3e2a +
          (uVar17 >> 0x1b | uVar17 * 0x20);
  uVar6 = uVar31 ^ uVar13 ^ uVar9 ^ uVar15;
  uVar6 = uVar6 >> 0x1f | uVar6 << 1;
  uVar9 = uVar23 ^ uVar10 ^ uVar30 ^ uVar6;
  uVar7 = uVar4 >> 2 | uVar4 * 0x40000000;
  uVar19 = (uVar20 ^ uVar7 ^ uVar17) + uVar12 + uVar22 + -0x359d3e2a +
           (uVar8 >> 0x1b | uVar8 * 0x20);
  uVar22 = uVar25 >> 0x1f | uVar25 << 1;
  uVar4 = uVar5 ^ uVar10 ^ uVar15 ^ uVar22;
  uVar5 = uVar14 >> 0x1f | uVar14 << 1;
  uVar23 = uVar33 ^ uVar27 ^ uVar26 ^ uVar5;
  uVar17 = uVar17 >> 2 | uVar17 * 0x40000000;
  uVar12 = (uVar7 ^ uVar17 ^ uVar8) + uVar6 + uVar20 + -0x359d3e2a +
           (uVar19 >> 0x1b | uVar19 * 0x20);
  uVar6 = uVar8 >> 2 | uVar8 * 0x40000000;
  uVar8 = (uVar17 ^ uVar6 ^ uVar19) + uVar5 + uVar7 + -0x359d3e2a + (uVar12 >> 0x1b | uVar12 * 0x20)
  ;
  uVar5 = uVar19 >> 2 | uVar19 * 0x40000000;
  uVar17 = (uVar6 ^ uVar5 ^ uVar12) + uVar22 + uVar17 + -0x359d3e2a + (uVar8 >> 0x1b | uVar8 * 0x20)
  ;
  uVar7 = uVar12 >> 2 | uVar12 * 0x40000000;
  uVar10 = (uVar5 ^ uVar7 ^ uVar8) + (uVar9 >> 0x1f | uVar9 << 1) + uVar6 + -0x359d3e2a +
           (uVar17 >> 0x1b | uVar17 * 0x20);
  uVar8 = uVar8 >> 2 | uVar8 * 0x40000000;
  uVar12 = (uVar7 ^ uVar8 ^ uVar17) + (uVar23 >> 0x1f | uVar23 << 1) + uVar5 + -0x359d3e2a +
           (uVar10 >> 0x1b | uVar10 * 0x20);
  auVar2 = vpinsrd_avx(ZEXT416(uVar12),uVar10 >> 2 | uVar10 * 0x40000000,1);
  uVar6 = uVar17 >> 2 | uVar17 * 0x40000000;
  auVar2 = vpinsrd_avx(auVar2,uVar6,2);
  auVar3 = vpinsrd_avx(auVar2,uVar8,3);
  auVar2._0_4_ = c->h1;
  auVar2._4_4_ = c->h2;
  auVar2._8_4_ = c->h3;
  auVar2._12_4_ = c->h4;
  auVar2 = vpaddd_avx(auVar3,auVar2);
  c->h0 = (uVar6 ^ uVar8 ^ uVar10) + (uVar4 >> 0x1f | uVar4 << 1) + uVar1 + uVar7 + -0x359d3e2a +
          (uVar12 >> 0x1b | uVar12 * 0x20);
  c->h1 = auVar2._0_4_;
  c->h2 = auVar2._4_4_;
  c->h3 = auVar2._8_4_;
  c->h4 = auVar2._12_4_;
  return;
}

Assistant:

void SHA1_Transform(uint32_t state[5], const uint8_t buffer[64]) {
  uint32_t a, b, c, d, e;
  typedef union {
    uint8_t c[64];
    uint32_t l[16];
  } CHAR64LONG16;
#ifdef SHA1HANDSOFF
  CHAR64LONG16 block[1]; /* use array to appear as a pointer */
  memcpy(block, buffer, 64);
#else
  /* The following had better never be used because it causes the
   * pointer-to-const buffer to be cast into a pointer to non-const.
   * And the result is written through.  I threw a "const" in, hoping
   * this will cause a diagnostic.
   */
  CHAR64LONG16 *block = (const CHAR64LONG16 *)buffer;
#endif
  /* Copy context->state[] to working vars */
  a = state[0];
  b = state[1];
  c = state[2];
  d = state[3];
  e = state[4];
  /* 4 rounds of 20 operations each. Loop unrolled. */
  R0(a, b, c, d, e, 0);
  R0(e, a, b, c, d, 1);
  R0(d, e, a, b, c, 2);
  R0(c, d, e, a, b, 3);
  R0(b, c, d, e, a, 4);
  R0(a, b, c, d, e, 5);
  R0(e, a, b, c, d, 6);
  R0(d, e, a, b, c, 7);
  R0(c, d, e, a, b, 8);
  R0(b, c, d, e, a, 9);
  R0(a, b, c, d, e, 10);
  R0(e, a, b, c, d, 11);
  R0(d, e, a, b, c, 12);
  R0(c, d, e, a, b, 13);
  R0(b, c, d, e, a, 14);
  R0(a, b, c, d, e, 15);
  R1(e, a, b, c, d, 16);
  R1(d, e, a, b, c, 17);
  R1(c, d, e, a, b, 18);
  R1(b, c, d, e, a, 19);
  R2(a, b, c, d, e, 20);
  R2(e, a, b, c, d, 21);
  R2(d, e, a, b, c, 22);
  R2(c, d, e, a, b, 23);
  R2(b, c, d, e, a, 24);
  R2(a, b, c, d, e, 25);
  R2(e, a, b, c, d, 26);
  R2(d, e, a, b, c, 27);
  R2(c, d, e, a, b, 28);
  R2(b, c, d, e, a, 29);
  R2(a, b, c, d, e, 30);
  R2(e, a, b, c, d, 31);
  R2(d, e, a, b, c, 32);
  R2(c, d, e, a, b, 33);
  R2(b, c, d, e, a, 34);
  R2(a, b, c, d, e, 35);
  R2(e, a, b, c, d, 36);
  R2(d, e, a, b, c, 37);
  R2(c, d, e, a, b, 38);
  R2(b, c, d, e, a, 39);
  R3(a, b, c, d, e, 40);
  R3(e, a, b, c, d, 41);
  R3(d, e, a, b, c, 42);
  R3(c, d, e, a, b, 43);
  R3(b, c, d, e, a, 44);
  R3(a, b, c, d, e, 45);
  R3(e, a, b, c, d, 46);
  R3(d, e, a, b, c, 47);
  R3(c, d, e, a, b, 48);
  R3(b, c, d, e, a, 49);
  R3(a, b, c, d, e, 50);
  R3(e, a, b, c, d, 51);
  R3(d, e, a, b, c, 52);
  R3(c, d, e, a, b, 53);
  R3(b, c, d, e, a, 54);
  R3(a, b, c, d, e, 55);
  R3(e, a, b, c, d, 56);
  R3(d, e, a, b, c, 57);
  R3(c, d, e, a, b, 58);
  R3(b, c, d, e, a, 59);
  R4(a, b, c, d, e, 60);
  R4(e, a, b, c, d, 61);
  R4(d, e, a, b, c, 62);
  R4(c, d, e, a, b, 63);
  R4(b, c, d, e, a, 64);
  R4(a, b, c, d, e, 65);
  R4(e, a, b, c, d, 66);
  R4(d, e, a, b, c, 67);
  R4(c, d, e, a, b, 68);
  R4(b, c, d, e, a, 69);
  R4(a, b, c, d, e, 70);
  R4(e, a, b, c, d, 71);
  R4(d, e, a, b, c, 72);
  R4(c, d, e, a, b, 73);
  R4(b, c, d, e, a, 74);
  R4(a, b, c, d, e, 75);
  R4(e, a, b, c, d, 76);
  R4(d, e, a, b, c, 77);
  R4(c, d, e, a, b, 78);
  R4(b, c, d, e, a, 79);
  /* Add the working vars back into context.state[] */
  state[0] += a;
  state[1] += b;
  state[2] += c;
  state[3] += d;
  state[4] += e;
  /* Wipe variables */
  a = b = c = d = e = 0;
#ifdef SHA1HANDSOFF
  memset(block, '\0', sizeof(block));
#endif
}